

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

iterator * __thiscall Catch::TextFlow::Columns::iterator::operator++(iterator *this)

{
  pointer pCVar1;
  pointer pcVar2;
  long lVar3;
  size_t i;
  ulong uVar4;
  
  lVar3 = 0;
  for (uVar4 = 0;
      pCVar1 = (this->m_columns->
               super__Vector_base<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>
               )._M_impl.super__Vector_impl_data._M_start,
      uVar4 < (ulong)((long)(this->m_columns->
                            super__Vector_base<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar1 >> 6);
      uVar4 = uVar4 + 1) {
    pcVar2 = (this->m_iterators).
             super__Vector_base<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((*(long *)((long)&(pcVar2->m_lineStart).m_it._M_current + lVar3) !=
         *(long *)((long)&(pCVar1->m_string).m_string + lVar3) +
         *(long *)((long)&(pCVar1->m_string).m_string + lVar3 + 8)) ||
       ((long)&(pCVar1->m_string).m_string + lVar3 != *(long *)((long)&pcVar2->m_column + lVar3))) {
      Column::const_iterator::operator++((const_iterator *)((long)&pcVar2->m_column + lVar3));
    }
    lVar3 = lVar3 + 0x40;
  }
  return this;
}

Assistant:

Columns::iterator& Columns::iterator::operator++() {
            for ( size_t i = 0; i < m_columns.size(); ++i ) {
                if ( m_iterators[i] != m_columns[i].end() ) {
                    ++m_iterators[i];
                }
            }
            return *this;
        }